

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*>
          (Geometry<std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,unsigned_long *it,CoordinateOrder *internalCoordinateOrder,
          allocator_type *allocator)

{
  long lVar1;
  unsigned_long uVar2;
  undefined8 uVar3;
  difference_type dVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  reference puVar7;
  size_t *psVar8;
  size_t *end_00;
  size_t *strideBegin;
  size_t s;
  size_t j;
  allocator_type *allocator_local;
  CoordinateOrder *internalCoordinateOrder_local;
  unsigned_long *it_local;
  Geometry<std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  end_local = begin;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this,allocator);
  dVar4 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (end_local,end);
  puVar5 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                     ((new_allocator<unsigned_long> *)this,dVar4 * 3,(void *)0x0);
  *(unsigned_long **)(this + 8) = puVar5;
  lVar1 = *(long *)(this + 8);
  dVar4 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (end_local,end);
  *(long *)(this + 0x10) = lVar1 + dVar4 * 8;
  lVar1 = *(long *)(this + 0x10);
  dVar4 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (end_local,end);
  *(long *)(this + 0x18) = lVar1 + dVar4 * 8;
  dVar4 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (end_local,end);
  *(difference_type *)(this + 0x20) = dVar4;
  *(undefined8 *)(this + 0x28) = 1;
  *(CoordinateOrder *)(this + 0x30) = *internalCoordinateOrder;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x1;
  sVar6 = Geometry<std::allocator<unsigned_long>_>::dimension
                    ((Geometry<std::allocator<unsigned_long>_> *)this);
  if (sVar6 != 0) {
    s = 0;
    internalCoordinateOrder_local = (CoordinateOrder *)it;
    while( true ) {
      sVar6 = Geometry<std::allocator<unsigned_long>_>::dimension
                        ((Geometry<std::allocator<unsigned_long>_> *)this);
      if (sVar6 <= s) break;
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&end_local);
      uVar2 = *puVar7;
      psVar8 = Geometry<std::allocator<unsigned_long>_>::shape
                         ((Geometry<std::allocator<unsigned_long>_> *)this,s);
      *psVar8 = uVar2;
      psVar8 = Geometry<std::allocator<unsigned_long>_>::size
                         ((Geometry<std::allocator<unsigned_long>_> *)this);
      *psVar8 = *psVar8 * uVar2;
      uVar3 = *(undefined8 *)internalCoordinateOrder_local;
      psVar8 = Geometry<std::allocator<unsigned_long>_>::strides
                         ((Geometry<std::allocator<unsigned_long>_> *)this,s);
      *psVar8 = uVar3;
      s = s + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&end_local);
      internalCoordinateOrder_local = internalCoordinateOrder_local + 2;
    }
    psVar8 = Geometry<std::allocator<unsigned_long>_>::shapeBegin
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    end_00 = Geometry<std::allocator<unsigned_long>_>::shapeEnd
                       ((Geometry<std::allocator<unsigned_long>_> *)this);
    strideBegin = Geometry<std::allocator<unsigned_long>_>::shapeStridesBegin
                            ((Geometry<std::allocator<unsigned_long>_> *)this);
    stridesFromShape<unsigned_long*,unsigned_long*>
              (psVar8,end_00,strideBegin,internalCoordinateOrder);
    Geometry<std::allocator<unsigned_long>_>::updateSimplicity
              ((Geometry<std::allocator<unsigned_long>_> *)this);
  }
  return;
}

Assistant:

inline
Geometry<A>::Geometry
(
    ShapeIterator begin, 
    ShapeIterator end,
    StrideIterator it,
    const CoordinateOrder& internalCoordinateOrder,
    const typename Geometry<A>::allocator_type& allocator
)
: allocator_(allocator),
  shape_(allocator_.allocate(std::distance(begin, end) * 3)), 
  shapeStrides_(shape_ + std::distance(begin, end)),
  strides_(shapeStrides_ + std::distance(begin, end)), 
  dimension_(std::distance(begin, end)),
  size_(1),
  coordinateOrder_(internalCoordinateOrder),
  isSimple_(true)
{
    if(dimension() != 0) {
        for(std::size_t j=0; j<dimension(); ++j, ++begin, ++it) {
            const std::size_t s = static_cast<std::size_t>(*begin);
            shape(j) = s;
            size() *= s;
            strides(j) = *it;
        }
        stridesFromShape(shapeBegin(), shapeEnd(), shapeStridesBegin(), 
            internalCoordinateOrder);
        updateSimplicity();
    }
}